

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

void http2_data_done(Curl_cfilter *cf,Curl_easy *data,_Bool premature)

{
  HTTP *pHVar1;
  uint *puVar2;
  undefined8 *puVar3;
  nghttp2_session *session;
  bool bVar4;
  _Bool _Var5;
  uint uVar6;
  size_t size;
  long lVar7;
  
  if (data == (Curl_easy *)0x0) {
    return;
  }
  pHVar1 = (data->req).p.http;
  if (pHVar1 == (HTTP *)0x0) {
    return;
  }
  puVar2 = (uint *)pHVar1->h2_ctx;
  if (puVar2 == (uint *)0x0) {
    return;
  }
  puVar3 = (undefined8 *)cf->ctx;
  if ((nghttp2_session *)*puVar3 != (nghttp2_session *)0x0) {
    bVar4 = false;
    nghttp2_session_set_stream_user_data((nghttp2_session *)*puVar3,*puVar2,(void *)0x0);
    if (*(char *)((long)puVar2 + 0x14d) == '\0') {
      uVar6 = *puVar2;
      if ((int)uVar6 < 1) {
        bVar4 = false;
      }
      else {
        if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"[%d] premature DATA_DONE, RST stream",(ulong)uVar6);
          uVar6 = *puVar2;
        }
        *(undefined2 *)((long)puVar2 + 0x14d) = 0x101;
        *(undefined1 *)((long)puVar2 + 0x151) = 1;
        nghttp2_submit_rst_stream((nghttp2_session *)*puVar3,'\0',uVar6,5);
        bVar4 = true;
      }
    }
    _Var5 = Curl_bufq_is_empty((bufq *)(puVar2 + 2));
    if (_Var5) {
      if (!bVar4) goto LAB_0051f31f;
    }
    else {
      session = (nghttp2_session *)*puVar3;
      uVar6 = *puVar2;
      size = Curl_bufq_len((bufq *)(puVar2 + 2));
      nghttp2_session_consume(session,uVar6,size);
    }
    nghttp2_session_send((nghttp2_session *)*puVar3);
  }
LAB_0051f31f:
  Curl_bufq_free((bufq *)(puVar2 + 0x12));
  Curl_bufq_free((bufq *)(puVar2 + 2));
  Curl_h1_req_parse_free((h1_req_parser *)(puVar2 + 0x22));
  Curl_dynhds_free((dynhds *)(puVar2 + 0x36));
  if (*(long *)(puVar2 + 0x4a) != 0) {
    lVar7 = *(long *)(puVar2 + 0x4c);
    while (lVar7 != 0) {
      (*Curl_cfree)(*(void **)((long)*(void **)(puVar2 + 0x4a) + lVar7 * 8 + -8));
      lVar7 = *(long *)(puVar2 + 0x4c) + -1;
      *(long *)(puVar2 + 0x4c) = lVar7;
    }
    (*Curl_cfree)(*(void **)(puVar2 + 0x4a));
    puVar2[0x4a] = 0;
    puVar2[0x4b] = 0;
  }
  (*Curl_cfree)(puVar2);
  ((data->req).p.http)->h2_ctx = (void *)0x0;
  return;
}

Assistant:

static void http2_data_done(struct Curl_cfilter *cf,
                            struct Curl_easy *data, bool premature)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);

  DEBUGASSERT(ctx);
  (void)premature;
  if(!stream)
    return;

  if(ctx->h2) {
    bool flush_egress = FALSE;
    /* returns error if stream not known, which is fine here */
    (void)nghttp2_session_set_stream_user_data(ctx->h2, stream->id, NULL);

    if(!stream->closed && stream->id > 0) {
      /* RST_STREAM */
      CURL_TRC_CF(data, cf, "[%d] premature DATA_DONE, RST stream",
                  stream->id);
      stream->closed = TRUE;
      stream->reset = TRUE;
      stream->send_closed = TRUE;
      nghttp2_submit_rst_stream(ctx->h2, NGHTTP2_FLAG_NONE,
                                stream->id, NGHTTP2_STREAM_CLOSED);
      flush_egress = TRUE;
    }
    if(!Curl_bufq_is_empty(&stream->recvbuf)) {
      /* Anything in the recvbuf is still being counted
       * in stream and connection window flow control. Need
       * to free that space or the connection window might get
       * exhausted eventually. */
      nghttp2_session_consume(ctx->h2, stream->id,
                              Curl_bufq_len(&stream->recvbuf));
      /* give WINDOW_UPATE a chance to be sent, but ignore any error */
      flush_egress = TRUE;
    }

    if(flush_egress)
      nghttp2_session_send(ctx->h2);
  }

  Curl_bufq_free(&stream->sendbuf);
  Curl_bufq_free(&stream->recvbuf);
  Curl_h1_req_parse_free(&stream->h1);
  Curl_dynhds_free(&stream->resp_trailers);
  if(stream->push_headers) {
    /* if they weren't used and then freed before */
    for(; stream->push_headers_used > 0; --stream->push_headers_used) {
      free(stream->push_headers[stream->push_headers_used - 1]);
    }
    free(stream->push_headers);
    stream->push_headers = NULL;
  }

  free(stream);
  H2_STREAM_LCTX(data) = NULL;
}